

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog
                      )

{
  uint uVar1;
  size_t hSize;
  U32 n;
  BYTE *op;
  BYTE huffWeight [255];
  BYTE local_3d [8];
  BYTE bitsToWeight [13];
  uint huffLog_local;
  uint maxSymbolValue_local;
  HUF_CElt *CTable_local;
  size_t maxDstSize_local;
  void *dst_local;
  
  bitsToWeight._9_4_ = maxSymbolValue;
  bitsToWeight._5_4_ = huffLog;
  if (maxSymbolValue < 0x100) {
    local_3d[0] = '\0';
    for (hSize._4_4_ = 1; hSize._4_4_ < bitsToWeight._5_4_ + 1; hSize._4_4_ = hSize._4_4_ + 1) {
      local_3d[hSize._4_4_] = ((BYTE)bitsToWeight._5_4_ + '\x01') - (char)hSize._4_4_;
    }
    for (hSize._4_4_ = 0; hSize._4_4_ < (uint)bitsToWeight._9_4_; hSize._4_4_ = hSize._4_4_ + 1) {
      huffWeight[(ulong)hSize._4_4_ - 8] = local_3d[CTable[hSize._4_4_].nbBits];
    }
    dst_local = (void *)HUF_compressWeights((void *)((long)dst + 1),maxDstSize - 1,&op,
                                            (ulong)(uint)bitsToWeight._9_4_);
    uVar1 = ERR_isError((size_t)dst_local);
    if (uVar1 == 0) {
      if (dst_local < (void *)0x2 || (void *)(ulong)((uint)bitsToWeight._9_4_ >> 1) <= dst_local) {
        if ((uint)bitsToWeight._9_4_ < 0x81) {
          if (maxDstSize < (bitsToWeight._9_4_ + 1 >> 1) + 1) {
            dst_local = (void *)0xffffffffffffffba;
          }
          else {
            *(BYTE *)dst = (BYTE)bitsToWeight._9_4_ + '\x7f';
            huffWeight[(ulong)(uint)bitsToWeight._9_4_ - 8] = '\0';
            for (hSize._4_4_ = 0; hSize._4_4_ < (uint)bitsToWeight._9_4_;
                hSize._4_4_ = hSize._4_4_ + 2) {
              *(BYTE *)((long)dst + (ulong)((hSize._4_4_ >> 1) + 1)) =
                   huffWeight[(ulong)hSize._4_4_ - 8] * '\x10' +
                   huffWeight[(ulong)(hSize._4_4_ + 1) - 8];
            }
            dst_local = (void *)(ulong)((bitsToWeight._9_4_ + 1 >> 1) + 1);
          }
        }
        else {
          dst_local = (void *)0xffffffffffffffff;
        }
      }
      else {
        *(char *)dst = (char)dst_local;
        dst_local = (void *)((long)dst_local + 1);
      }
    }
  }
  else {
    dst_local = (void *)0xffffffffffffffd2;
  }
  return (size_t)dst_local;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}